

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O1

bool __thiscall ProString::operator==(ProString *this,ProString *other)

{
  long lVar1;
  undefined1 uVar2;
  CutResult CVar3;
  CutResult CVar4;
  char16_t *pcVar5;
  long lVar6;
  char16_t *pcVar7;
  long lVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar7 = (this->m_string).d.ptr;
  local_40 = (long)this->m_offset;
  local_48 = (long)this->m_length;
  CVar3 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_40,&local_48);
  lVar1 = local_40;
  uVar2 = 0;
  lVar8 = 0;
  if (CVar3 != Null) {
    lVar8 = local_48;
  }
  pcVar5 = (other->m_string).d.ptr;
  local_40 = (long)other->m_offset;
  local_48 = (long)other->m_length;
  CVar4 = QtPrivate::QContainerImplHelper::mid((other->m_string).d.size,&local_40,&local_48);
  lVar6 = 0;
  if (CVar4 != Null) {
    lVar6 = local_48;
  }
  if (lVar8 == lVar6) {
    pcVar5 = pcVar5 + local_40;
    if (CVar4 == Null) {
      pcVar5 = (char16_t *)0x0;
    }
    pcVar7 = pcVar7 + lVar1;
    if (CVar3 == Null) {
      pcVar7 = (char16_t *)0x0;
    }
    QVar9.m_data = pcVar7;
    QVar9.m_size = lVar8;
    QVar10.m_data = pcVar5;
    QVar10.m_size = lVar6;
    uVar2 = QtPrivate::equalStrings(QVar9,QVar10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const ProString &other) const { return toQStringView() == other.toQStringView(); }